

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O2

void __thiscall
sc_core::sc_vector_base::context_scope::context_scope(context_scope *this,sc_vector_base *owner)

{
  sc_simcontext *this_00;
  sc_object *psVar1;
  sc_simcontext *psVar2;
  sc_object *psVar3;
  
  this->owner_ = (sc_vector_base *)0x0;
  this_00 = (owner->super_sc_object).m_simc;
  psVar2 = sc_get_curr_simcontext();
  if (this_00 != psVar2) {
    sc_assertion_failed("simc == sc_get_curr_simcontext()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/utils/sc_vector.cpp"
                        ,0x89);
  }
  psVar1 = (owner->super_sc_object).m_parent;
  psVar3 = sc_simcontext::active_object(this_00);
  if (psVar1 != psVar3) {
    this->owner_ = owner;
    sc_object_manager::hierarchy_push
              (((owner->super_sc_object).m_simc)->m_object_manager,(owner->super_sc_object).m_parent
              );
    return;
  }
  return;
}

Assistant:

sc_vector_base::context_scope::context_scope( sc_vector_base* owner )
  : owner_(NULL)
{
  sc_simcontext* simc = owner->simcontext();
  sc_assert( simc == sc_get_curr_simcontext() );

  sc_object* parent = owner->get_parent_object();
  sc_object* active = simc->active_object();

  if (parent != active) // override object creation context
  {
    owner_ = owner;
    owner->simcontext()->get_object_manager()
      ->hierarchy_push( owner_->get_parent_object() );
  }
}